

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O1

mz_uint32 mz_zip_writer_create_zip64_extra_data
                    (mz_uint8 *pBuf,mz_uint64 *pUncomp_size,mz_uint64 *pComp_size,
                    mz_uint64 *pLocal_header_ofs)

{
  mz_uint64 *pmVar1;
  mz_uint8 mVar2;
  mz_uint8 *pDst;
  
  pBuf[0] = '\x01';
  pBuf[1] = '\0';
  pBuf[2] = '\0';
  pBuf[3] = '\0';
  if (pUncomp_size == (mz_uint64 *)0x0) {
    pmVar1 = (mz_uint64 *)(pBuf + 4);
    mVar2 = '\0';
  }
  else {
    *(mz_uint64 *)(pBuf + 4) = *pUncomp_size;
    pmVar1 = (mz_uint64 *)(pBuf + 0xc);
    mVar2 = '\b';
  }
  if (pComp_size != (mz_uint64 *)0x0) {
    *pmVar1 = *pComp_size;
    pmVar1 = pmVar1 + 1;
    mVar2 = mVar2 + '\b';
  }
  if (pLocal_header_ofs != (mz_uint64 *)0x0) {
    *pmVar1 = *pLocal_header_ofs;
    pmVar1 = pmVar1 + 1;
    mVar2 = mVar2 + '\b';
  }
  pBuf[2] = mVar2;
  pBuf[3] = '\0';
  return (int)pmVar1 - (int)pBuf;
}

Assistant:

static mz_uint32 mz_zip_writer_create_zip64_extra_data(mz_uint8 *pBuf, mz_uint64 *pUncomp_size, mz_uint64 *pComp_size, mz_uint64 *pLocal_header_ofs)
{
    mz_uint8 *pDst = pBuf;
    mz_uint32 field_size = 0;

    MZ_WRITE_LE16(pDst + 0, MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID);
    MZ_WRITE_LE16(pDst + 2, 0);
    pDst += sizeof(mz_uint16) * 2;

    if (pUncomp_size)
    {
        MZ_WRITE_LE64(pDst, *pUncomp_size);
        pDst += sizeof(mz_uint64);
        field_size += sizeof(mz_uint64);
    }

    if (pComp_size)
    {
        MZ_WRITE_LE64(pDst, *pComp_size);
        pDst += sizeof(mz_uint64);
        field_size += sizeof(mz_uint64);
    }

    if (pLocal_header_ofs)
    {
        MZ_WRITE_LE64(pDst, *pLocal_header_ofs);
        pDst += sizeof(mz_uint64);
        field_size += sizeof(mz_uint64);
    }

    MZ_WRITE_LE16(pBuf + 2, field_size);

    return (mz_uint32)(pDst - pBuf);
}